

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

Program __thiscall DeadCodeElimination::run(DeadCodeElimination *this,Program *program)

{
  Function *pFVar1;
  mapped_type pFVar2;
  Function *this_00;
  mapped_type *ppFVar3;
  Function *extraout_RDX;
  Program *pPVar4;
  Program PVar5;
  Function *function_1;
  Function *function;
  _Rb_tree_node_base local_88;
  size_t local_68;
  FunctionTable function_table;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pPVar4 = program;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pFVar1 = pPVar4->first, pFVar1 != (Function *)0x0) {
    function = pFVar1;
    this_00 = (Function *)operator_new(0x60);
    Function::Function(this_00,&pFVar1->argument_types,pFVar1->return_type);
    Program::add_function((Program *)this,this_00);
    ppFVar3 = std::
              map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
              ::operator[](&function_table,&function);
    *ppFVar3 = this_00;
    pPVar4 = (Program *)&pFVar1->next_function;
  }
  while (pFVar1 = program->first, pFVar1 != (Function *)0x0) {
    function_1 = pFVar1;
    ppFVar3 = std::
              map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
              ::operator[](&function_table,&function_1);
    pFVar2 = *ppFVar3;
    local_88._M_color = _S_red;
    local_88._M_parent = (_Base_ptr)0x0;
    local_68 = 0;
    local_88._M_left = &local_88;
    local_88._M_right = &local_88;
    Mark::evaluate((UsageTable *)&function,&function_1->block);
    Sweep::evaluate(&function_table,(UsageTable *)&function,&pFVar2->block,&function_1->block);
    std::
    _Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_bool>,_std::_Select1st<std::pair<const_Expression_*const,_bool>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
    ::~_Rb_tree((_Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_bool>,_std::_Select1st<std::pair<const_Expression_*const,_bool>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
                 *)&function);
    program = (Program *)&pFVar1->next_function;
  }
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~_Rb_tree(&function_table._M_t);
  PVar5.last = extraout_RDX;
  PVar5.first = (Function *)this;
  return PVar5;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		FunctionTable function_table;
		for (const Function* function: program) {
			Function* new_function = new Function(function->get_argument_types(), function->get_return_type());
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			Function* new_function = function_table[function];
			UsageTable usage_table;
			Mark::evaluate(usage_table, function->get_block());
			Sweep::evaluate(function_table, usage_table, new_function->get_block(), function->get_block());
		}
		return new_program;
	}